

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::init
          (UploadWaitDrawCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  NotSupportedError *this_00;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  int numBytes;
  char *local_440;
  char *local_438;
  char *local_328;
  string local_320;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  MessageBuilder local_2e8;
  int local_168;
  int local_164;
  int index;
  int sampleNdx;
  int numSwaps;
  LayeredGridSpec scene_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  GLenum indexUsage;
  GLenum vertexUsage;
  Buffer vertexCopyBuffer;
  LayeredGridSpec scene;
  string local_100;
  int local_cc;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  undefined4 local_20;
  int vertexUploadDataSize;
  int vertexIndexSize;
  int vertexAttribSize;
  Functions *gl;
  UploadWaitDrawCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles3::Context::getRenderContext
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _vertexIndexSize = CONCAT44(extraout_var,iVar2);
  vertexUploadDataSize = 0x20;
  local_20 = 4;
  local_24 = 4;
  if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
    local_24 = 0x20;
  }
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar5 = gles3::Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar5);
  if (0x7f < iVar2) {
    pRVar5 = gles3::Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    iVar2 = tcu::RenderTarget::getHeight(pRVar5);
    if (0x7f < iVar2) {
      (**(code **)(_vertexIndexSize + 0x1a00))(0,0,0x80);
      (**(code **)(_vertexIndexSize + 0x120))(0x302,0x303);
      (**(code **)(_vertexIndexSize + 0x100))(0x8006);
      (**(code **)(_vertexIndexSize + 0x5e0))(0xbe2);
      vertexCopyBuffer.super_ObjectWrapper._20_4_ = 0x5d;
      scene.gridWidth = 5;
      generateLayeredGridVertexAttribData4C4V
                (&this->m_vertexData,
                 (LayeredGridSpec *)&vertexCopyBuffer.super_ObjectWrapper.field_0x14);
      generateLayeredGridIndexData
                (&this->m_indexData,
                 (LayeredGridSpec *)&vertexCopyBuffer.super_ObjectWrapper.field_0x14);
      iVar2 = getLayeredGridNumVertices
                        ((LayeredGridSpec *)&vertexCopyBuffer.super_ObjectWrapper.field_0x14);
      this->m_numVertices = iVar2;
      if (this->m_bufferState == BUFFERSTATE_NEW) {
        if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
          if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
            pRVar4 = gles3::Context::getRenderContext
                               ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
            glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                      ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexUsage,pRVar4);
            (**(code **)(_vertexIndexSize + 0x6c8))(1,&this->m_indexBuffer);
            pcVar1 = *(code **)(_vertexIndexSize + 0x40);
            dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&indexUsage);
            (*pcVar1)(0x8892,dVar3);
            (**(code **)(_vertexIndexSize + 0x40))(0x8893,this->m_indexBuffer);
            pcVar1 = *(code **)(_vertexIndexSize + 0x150);
            sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    size(&this->m_vertexData);
            pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[](&this->m_vertexData,0);
            (*pcVar1)(0x8892,sVar6 << 4,pvVar7,0x88e4);
            pcVar1 = *(code **)(_vertexIndexSize + 0x150);
            sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (&this->m_indexData);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->m_indexData,0);
            (*pcVar1)(0x8893,sVar6 << 2,pvVar8,0x88e4);
            RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
            (**(code **)(_vertexIndexSize + 0x568))(4,this->m_numVertices,0x1405,0);
            glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                      ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexUsage);
          }
          else if (this->m_targetBuffer == TARGETBUFFER_INDEX) {
            (**(code **)(_vertexIndexSize + 0x6c8))(1,&this->m_vertexBuffer);
            (**(code **)(_vertexIndexSize + 0x40))(0x8892,this->m_vertexBuffer);
            pcVar1 = *(code **)(_vertexIndexSize + 0x150);
            sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    size(&this->m_vertexData);
            pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[](&this->m_vertexData,0);
            (*pcVar1)(0x8892,sVar6 << 4,pvVar7,0x88e4);
            RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
            (**(code **)(_vertexIndexSize + 0x538))(4,0,this->m_numVertices);
          }
        }
      }
      else if (this->m_bufferState == BUFFERSTATE_EXISTING) {
        (**(code **)(_vertexIndexSize + 0x6c8))(1,&this->m_vertexBuffer);
        (**(code **)(_vertexIndexSize + 0x40))(0x8892,this->m_vertexBuffer);
        pcVar1 = *(code **)(_vertexIndexSize + 0x150);
        sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          (&this->m_vertexData);
        pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](&this->m_vertexData,0);
        (*pcVar1)(0x8892,sVar6 << 4,pvVar7,0x88e4);
        if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
          (**(code **)(_vertexIndexSize + 0x6c8))(1,&this->m_indexBuffer);
          (**(code **)(_vertexIndexSize + 0x40))(0x8893,this->m_indexBuffer);
          pcVar1 = *(code **)(_vertexIndexSize + 0x150);
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_indexData)
          ;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->m_indexData,0);
          (*pcVar1)(0x8893,sVar6 << 2,pvVar8,0x88e4);
        }
        RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
        if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
          (**(code **)(_vertexIndexSize + 0x538))(4,0,this->m_numVertices);
        }
        else if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
          (**(code **)(_vertexIndexSize + 0x568))(4,this->m_numVertices,0x1405,0);
        }
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &scene_1.gridHeight);
      sampleNdx = 0x28;
      numSwaps = 0x28;
      scene_1.gridWidth = 5;
      generateLayeredGridVertexAttribData4C4V
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &scene_1.gridHeight,(LayeredGridSpec *)&sampleNdx);
      (**(code **)(_vertexIndexSize + 0x6c8))(1,&this->m_miscBuffer);
      (**(code **)(_vertexIndexSize + 0x40))(0x8892,this->m_miscBuffer);
      pcVar1 = *(code **)(_vertexIndexSize + 0x150);
      sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &scene_1.gridHeight);
      pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &scene_1.gridHeight,0);
      (*pcVar1)(0x8892,sVar6 << 4,pvVar7,0x88e4);
      iVar2 = getLayeredGridNumVertices((LayeredGridSpec *)&sampleNdx);
      this->m_numMiscVertices = iVar2;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &scene_1.gridHeight);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
      ::resize(&this->m_samples,(long)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap));
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ::resize(&this->m_results,(long)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap));
      for (index = 0; index <= this->m_numMaxSwaps; index = index + 1) {
        for (local_164 = 0; iVar2 = index, local_164 < this->m_numSamplesPerSwap;
            local_164 = local_164 + 1) {
          local_168 = index * this->m_numSamplesPerSwap + local_164;
          pvVar9 = std::
                   vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ::operator[](&this->m_samples,(long)local_168);
          pvVar9->numFrames = iVar2;
        }
      }
      sVar6 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
              ::size(&this->m_samples);
      std::vector<int,_std::allocator<int>_>::resize(&this->m_iterationOrder,sVar6);
      sVar6 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
              ::size(&this->m_samples);
      generateTwoPassRandomIterationOrder(&this->m_iterationOrder,(int)sVar6);
      this_01 = tcu::TestContext::getLog
                          ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_2e8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_2e8,(char (*) [24])"Measuring time used in ")
      ;
      local_2f0 = "Draw method: drawElements";
      if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
        local_2f0 = "Draw method: drawArrays";
      }
      local_2f0 = local_2f0 + 0xd;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2f0);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [23])" and readPixels call.\n");
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [93])
                                   "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, "
                          );
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_numMaxSwaps);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2a612bf);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [22])"Uploaded buffer is a ");
      local_2f8 = "index";
      if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
        local_2f8 = "vertex attribute";
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2f8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x2bd059a);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [17])"Uploading using ");
      if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) {
        local_438 = "bufferData";
      }
      else {
        if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
          local_440 = "bufferSubData";
        }
        else {
          local_440 = (char *)0x0;
          if (this->m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) {
            local_440 = 
            "mapBufferRange, flags = GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT"
            ;
          }
        }
        local_438 = local_440;
      }
      local_300 = local_438;
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_300);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x2b8f97b);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [16])"Upload size is ");
      Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                (&local_320,(_anonymous_namespace_ *)(ulong)(uint)(this->m_numVertices * local_24),
                 numBytes);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_320);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2c7b265);
      local_328 = "";
      if (this->m_bufferState == BUFFERSTATE_EXISTING) {
        local_328 = "All test samples use the same buffer object.\n";
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_328);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [88])
                                   "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
                          );
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [101])
                                   "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
                          );
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_320);
      tcu::MessageBuilder::~MessageBuilder(&local_2e8);
      return extraout_EAX;
    }
  }
  scene.gridHeight._3_1_ = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_cc = 0x80;
  de::toString<int>(&local_c8,&local_cc);
  std::operator+(&local_a8,"Test case requires ",&local_c8);
  std::operator+(&local_88,&local_a8,"x");
  scene.gridLayers = 0x80;
  de::toString<int>(&local_100,&scene.gridLayers);
  std::operator+(&local_68,&local_88,&local_100);
  std::operator+(&local_48,&local_68," render target");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
  scene.gridHeight._3_1_ = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void UploadWaitDrawCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				vertexAttribSize		= (int)sizeof(tcu::Vec4) * 2; // color4, position4
	const int				vertexIndexSize			= (int)sizeof(deUint32);
	const int				vertexUploadDataSize	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (vertexAttribSize) : (vertexIndexSize);

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded

	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// scene

	{
		LayeredGridSpec scene;

		// create ~8MB workload with similar characteristics as in the other test
		// => makes comparison to other results more straightforward
		scene.gridWidth = 93;
		scene.gridHeight = 93;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(m_vertexData, scene);
		generateLayeredGridIndexData(m_indexData, scene);
		m_numVertices = getLayeredGridNumVertices(scene);
	}

	// buffers

	if (m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			// reads from two buffers, prepare the static buffer

			if (m_targetBuffer == TARGETBUFFER_VERTEX)
			{
				// index buffer is static, use another vertex buffer to keep original buffer in unused state
				const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

				gl.genBuffers(1, &m_indexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);
				gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
			}
			else if (m_targetBuffer == TARGETBUFFER_INDEX)
			{
				// vertex buffer is static
				gl.genBuffers(1, &m_vertexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
			}
			else
				DE_ASSERT(false);
		}
	}
	else if (m_bufferState == BUFFERSTATE_EXISTING)
	{
		const glw::GLenum vertexUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);

		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], vertexUsage);

		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_indexBuffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], indexUsage);
		}

		setupVertexAttribs();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	// misc draw buffer
	{
		std::vector<tcu::Vec4>	vertexData;
		LayeredGridSpec			scene;

		// create ~1.5MB workload with similar characteristics
		scene.gridWidth = 40;
		scene.gridHeight = 40;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(vertexData, scene);

		gl.genBuffers(1, &m_miscBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_miscBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(sizeof(tcu::Vec4) * vertexData.size()), &vertexData[0], GL_STATIC_DRAW);

		m_numMiscVertices = getLayeredGridNumVertices(scene);
	}

	// iterations
	{
		m_samples.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);
		m_results.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);

		for (int numSwaps = 0; numSwaps <= m_numMaxSwaps; ++numSwaps)
		for (int sampleNdx = 0; sampleNdx < m_numSamplesPerSwap; ++sampleNdx)
		{
			const int index = numSwaps*m_numSamplesPerSwap + sampleNdx;

			m_samples[index].numFrames = numSwaps;
		}

		m_iterationOrder.resize(m_samples.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_samples.size());
	}

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring time used in " << ((m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements")) << " and readPixels call.\n"
		<< "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, " << m_numMaxSwaps << "].\n"
		<< "Uploaded buffer is a " << ((m_targetBuffer == TARGETBUFFER_VERTEX) ? ("vertex attribute") : ("index")) << " buffer.\n"
		<< "Uploading using "
			<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)		? ("bufferData")																							:
				(m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)	? ("bufferSubData")																							:
				(m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)	? ("mapBufferRange, flags = GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT")	:
				((const char*)DE_NULL))
			<< "\n"
		<< "Upload size is " << getHumanReadableByteSize(m_numVertices * vertexUploadDataSize) << ".\n"
		<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("All test samples use the same buffer object.\n") : (""))
		<< "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
		<< "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
		<< tcu::TestLog::EndMessage;
}